

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPTransporter.h
# Opt level: O0

void __thiscall jaegertracing::utils::UDPTransporter::emitBatch(UDPTransporter *this,Batch *batch)

{
  int __v;
  HandleType __fd;
  element_type *peVar1;
  pointer pAVar2;
  ostream *poVar3;
  size_type sVar4;
  logic_error *this_00;
  ssize_t sVar5;
  system_error *this_01;
  int *piVar6;
  error_category *__ecat;
  string local_378;
  ostringstream local_358 [8];
  ostringstream oss_1;
  ssize_t numWritten;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  uint32_t local_24;
  uint8_t *puStack_20;
  uint32_t size;
  uint8_t *data;
  Batch *batch_local;
  UDPTransporter *this_local;
  
  data = (uint8_t *)batch;
  batch_local = (Batch *)this;
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_buffer);
  apache::thrift::transport::TMemoryBuffer::resetBuffer(peVar1);
  pAVar2 = std::
           unique_ptr<jaegertracing::agent::thrift::AgentClient,_std::default_delete<jaegertracing::agent::thrift::AgentClient>_>
           ::operator->(&this->_client);
  (**(code **)(*(long *)pAVar2 + 0x18))(pAVar2,data);
  puStack_20 = (uint8_t *)0x0;
  local_24 = 0;
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_buffer);
  apache::thrift::transport::TMemoryBuffer::getBuffer(peVar1,&stack0xffffffffffffffe0,&local_24);
  if ((this->super_Transport)._maxPacketSize < (int)local_24) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,"Data does not fit within one UDP packet, size ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
    poVar3 = std::operator<<(poVar3,", max ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_Transport)._maxPacketSize);
    poVar3 = std::operator<<(poVar3,", spans ");
    sVar4 = std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::
            size((vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>
                  *)(data + 0x50));
    std::ostream::operator<<(poVar3,sVar4);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::logic_error::logic_error(this_00,local_1d0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __fd = net::Socket::handle(&(this->super_Transport)._socket);
  sVar5 = send(__fd,puStack_20,(ulong)local_24,0);
  if ((uint)sVar5 != local_24) {
    std::__cxx11::ostringstream::ostringstream(local_358);
    poVar3 = std::operator<<((ostream *)local_358,"Failed to write message, numWritten=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3,", size=");
    std::ostream::operator<<(poVar3,local_24);
    this_01 = (system_error *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    __v = *piVar6;
    __ecat = (error_category *)std::_V2::system_category();
    std::__cxx11::ostringstream::str();
    std::system_error::system_error(this_01,__v,__ecat,&local_378);
    __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

void emitBatch(const thrift::Batch& batch) override
    {
        _buffer->resetBuffer();
        _client->emitBatch(batch);
        uint8_t* data = nullptr;
        uint32_t size = 0;
        _buffer->getBuffer(&data, &size);
        if (static_cast<int>(size) > _maxPacketSize) {
            std::ostringstream oss;
            oss << "Data does not fit within one UDP packet"
                   ", size "
                << size << ", max " << _maxPacketSize << ", spans "
                << batch.spans.size();
            throw std::logic_error(oss.str());
        }
        const auto numWritten = ::send(_socket.handle(), reinterpret_cast<char*>(data), sizeof(uint8_t) * size, 0);
        if (static_cast<unsigned>(numWritten) != size) {
            std::ostringstream oss;
            oss << "Failed to write message"
                   ", numWritten="
                << numWritten << ", size=" << size;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
    }